

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshDenoisingBase.cpp
# Opt level: O0

void __thiscall
MeshDenoisingBase::getFaceNormal
          (MeshDenoisingBase *this,TriMesh *mesh,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *normals)

{
  double dVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  size_type __new_size;
  reference pvVar5;
  Normal *pNVar6;
  BaseHandle *this_00;
  reference pvVar7;
  Normal n;
  undefined1 local_30 [8];
  FaceIter f_it;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  *normals_local;
  TriMesh *mesh_local;
  MeshDenoisingBase *this_local;
  
  f_it._8_8_ = normals;
  OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
  request_face_normals
            ((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *)
             mesh);
  OpenMesh::
  PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
  ::update_face_normals
            ((PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
              *)mesh);
  uVar2 = f_it._8_8_;
  __new_size = (**(code **)(*(long *)&(mesh->super_Mesh).
                                      super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                      .
                                      super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                           + 0x28))();
  std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::resize
            ((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> *
             )uVar2,__new_size);
  _local_30 = OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)mesh);
  while( true ) {
    join_0x00000010_0x00000000_ = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)mesh);
    bVar3 = OpenMesh::Iterators::
            GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
            ::operator!=((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                          *)local_30,
                         (GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                          *)(n.super_VectorDataT<double,_3>.values_ + 2));
    if (!bVar3) break;
    pvVar5 = OpenMesh::Iterators::
             GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
             ::operator*((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                          *)local_30);
    pNVar6 = OpenMesh::
             AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
             normal((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                     *)mesh,(FaceHandle)(pvVar5->super_BaseHandle).idx_);
    uVar2 = f_it._8_8_;
    dVar1 = (pNVar6->super_VectorDataT<double,_3>).values_[0];
    n.super_VectorDataT<double,_3>.values_[0] = (pNVar6->super_VectorDataT<double,_3>).values_[1];
    n.super_VectorDataT<double,_3>.values_[1] = (pNVar6->super_VectorDataT<double,_3>).values_[2];
    this_00 = &OpenMesh::Iterators::
               GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
               ::operator->((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                             *)local_30)->super_BaseHandle;
    iVar4 = OpenMesh::BaseHandle::idx(this_00);
    pvVar7 = std::
             vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
             operator[]((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                         *)uVar2,(long)iVar4);
    (pvVar7->super_VectorDataT<double,_3>).values_[0] = dVar1;
    (pvVar7->super_VectorDataT<double,_3>).values_[1] = n.super_VectorDataT<double,_3>.values_[0];
    (pvVar7->super_VectorDataT<double,_3>).values_[2] = n.super_VectorDataT<double,_3>.values_[1];
    OpenMesh::Iterators::
    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
    ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                  *)local_30,0);
  }
  return;
}

Assistant:

void MeshDenoisingBase::getFaceNormal(TriMesh &mesh, std::vector<TriMesh::Normal> &normals)
{
    mesh.request_face_normals();
    mesh.update_face_normals();

    normals.resize(mesh.n_faces());
    for(TriMesh::FaceIter f_it = mesh.faces_begin(); f_it != mesh.faces_end(); f_it++)
    {
        TriMesh::Normal n = mesh.normal(*f_it);
        normals[f_it->idx()] = n;
    }
}